

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

JsonObjectWriter * __thiscall Catch::JsonReporter::startObject(JsonReporter *this)

{
  _Elt_pointer pJVar1;
  _Elt_pointer pJVar2;
  JsonObjectWriter local_30;
  
  pJVar2 = (this->m_arrayWriters).c.
           super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_arrayWriters).c.
                super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_arrayWriters).c.
             super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonArrayWriter::writeObject(&local_30,pJVar2 + -1);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::
  emplace_back<Catch::JsonObjectWriter>(&(this->m_objectWriters).c,&local_30);
  JsonObjectWriter::~JsonObjectWriter(&local_30);
  local_30.m_os._0_4_ = 0;
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  emplace_back<Catch::JsonReporter::Writer>(&(this->m_writers).c,(Writer *)&local_30);
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  return pJVar1 + -1;
}

Assistant:

JsonObjectWriter& JsonReporter::startObject() {
        m_objectWriters.emplace( m_arrayWriters.top().writeObject() );
        m_writers.emplace( Writer::Object );
        return m_objectWriters.top();
    }